

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O1

ENDPOINT_INSTANCE *
find_session_endpoint_by_outgoing_channel(CONNECTION_HANDLE connection,uint16_t outgoing_channel)

{
  uint uVar1;
  LOGGER_LOG p_Var2;
  ulong uVar3;
  ENDPOINT_INSTANCE *pEVar4;
  
  uVar1 = connection->endpoint_count;
  if (uVar1 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      if (connection->endpoints[uVar3]->outgoing_channel == outgoing_channel) goto LAB_00167ce1;
      uVar3 = uVar3 + 1;
    } while (uVar1 != (uint)uVar3);
    uVar3 = (ulong)uVar1;
  }
LAB_00167ce1:
  if ((uint)uVar3 == uVar1) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      pEVar4 = (ENDPOINT_INSTANCE *)0x0;
    }
    else {
      pEVar4 = (ENDPOINT_INSTANCE *)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/connection.c"
                ,"find_session_endpoint_by_outgoing_channel",0x251,1,
                "Cannot find session endpoint for channel %u",outgoing_channel);
    }
  }
  else {
    pEVar4 = connection->endpoints[uVar3 & 0xffffffff];
  }
  return pEVar4;
}

Assistant:

static ENDPOINT_INSTANCE* find_session_endpoint_by_outgoing_channel(CONNECTION_HANDLE connection, uint16_t outgoing_channel)
{
    uint32_t i;
    ENDPOINT_INSTANCE* result;

    for (i = 0; i < connection->endpoint_count; i++)
    {
        if (connection->endpoints[i]->outgoing_channel == outgoing_channel)
        {
            break;
        }
    }

    if (i == connection->endpoint_count)
    {
        LogError("Cannot find session endpoint for channel %u", (unsigned int)outgoing_channel);
        result = NULL;
    }
    else
    {
        result = connection->endpoints[i];
    }

    return result;
}